

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O3

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
                  TextureViewDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  TEXTURE_VIEW_TYPE TVar2;
  RESOURCE_DIMENSION RVar3;
  TEXTURE_FORMAT TVar4;
  Uint32 UVar5;
  Uint32 UVar6;
  anon_union_4_2_fd7742d7_for_TextureViewDesc_6 aVar7;
  anon_union_4_2_468fdb0b_for_TextureViewDesc_8 aVar8;
  UAV_ACCESS_FLAG UVar9;
  TEXTURE_VIEW_FLAGS TVar10;
  TEXTURE_COMPONENT_SWIZZLE TVar11;
  TEXTURE_COMPONENT_SWIZZLE TVar12;
  int iVar13;
  size_t sVar14;
  IMemoryAllocator *pIVar15;
  char *pcVar16;
  undefined4 extraout_var_00;
  TextureViewDesc *Args_1;
  RefCountersImpl *this_00;
  RenderDeviceGLImpl *pRVar17;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::ITextureViewGL>::RefCountedObject<>
            ((RefCountedObject<Diligent::ITextureViewGL> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::ITextureViewGL>).
  super_RefCountedObject<Diligent::ITextureViewGL>.super_ITextureViewGL.super_ITextureView.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00af3f90;
  this->m_pDevice = pDevice;
  TVar2 = ObjDesc->ViewType;
  RVar3 = ObjDesc->TextureDim;
  TVar4 = ObjDesc->Format;
  UVar5 = ObjDesc->MostDetailedMip;
  UVar6 = ObjDesc->NumMipLevels;
  aVar7 = ObjDesc->field_5;
  aVar8 = ObjDesc->field_6;
  UVar9 = ObjDesc->AccessFlags;
  TVar10 = ObjDesc->Flags;
  TVar11 = (ObjDesc->Swizzle).R;
  TVar12 = (ObjDesc->Swizzle).G;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).ViewType = TVar2;
  (this->m_Desc).TextureDim = RVar3;
  (this->m_Desc).Format = TVar4;
  (this->m_Desc).MostDetailedMip = UVar5;
  (this->m_Desc).NumMipLevels = UVar6;
  (this->m_Desc).field_5 = aVar7;
  (this->m_Desc).field_6 = aVar8;
  (this->m_Desc).AccessFlags = UVar9;
  (this->m_Desc).Flags = TVar10;
  (this->m_Desc).Swizzle.R = TVar11;
  (this->m_Desc).Swizzle.G = TVar12;
  *(undefined8 *)&(this->m_Desc).Swizzle.B = *(undefined8 *)&(ObjDesc->Swizzle).B;
  if (pDevice == (RenderDeviceGLImpl *)0x0) {
    iVar13 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_UniqueId;
    iVar13 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar13 = iVar13 + 1;
  }
  this->m_UniqueID = iVar13;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    pRVar17 = this->m_pDevice;
    if (pRVar17 == (RenderDeviceGLImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (TextureViewDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pRVar17 = this->m_pDevice;
    }
    this_00 = (pRVar17->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
              super_ObjectBase<Diligent::IRenderDeviceGL>.
              super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters;
    if (this_00 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pRVar17->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
                super_ObjectBase<Diligent::IRenderDeviceGL>.
                super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters;
    }
    RefCountersImpl::AddStrongRef(this_00);
  }
  pcVar16 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar16 == (char *)0x0) {
    pIVar15 = GetStringAllocator();
    iVar13 = (**pIVar15->_vptr_IMemoryAllocator)
                       (pIVar15,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar16 = (char *)CONCAT44(extraout_var_00,iVar13);
    snprintf(pcVar16,0x13,"0x%llX",this);
  }
  else {
    sVar14 = strlen(pcVar16);
    pIVar15 = GetStringAllocator();
    iVar13 = (**pIVar15->_vptr_IMemoryAllocator)
                       (pIVar15,sVar14 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar16 = (char *)CONCAT44(extraout_var,iVar13);
    memcpy(pcVar16,(ObjDesc->super_DeviceObjectAttribs).Name,sVar14 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar16;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }